

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

int64_t __thiscall
libtorrent::bdecode_node::list_int_value_at(bdecode_node *this,int i,int64_t default_val)

{
  type_t tVar1;
  undefined1 local_68 [8];
  bdecode_node n;
  int64_t default_val_local;
  int i_local;
  bdecode_node *this_local;
  
  n._56_8_ = default_val;
  list_at((bdecode_node *)local_68,this,i);
  tVar1 = type((bdecode_node *)local_68);
  if (tVar1 == int_t) {
    this_local = (bdecode_node *)int_value((bdecode_node *)local_68);
  }
  else {
    this_local = (bdecode_node *)n._56_8_;
  }
  ~bdecode_node((bdecode_node *)local_68);
  return (int64_t)this_local;
}

Assistant:

std::int64_t bdecode_node::list_int_value_at(int i
		, std::int64_t default_val) const
	{
		bdecode_node const n = list_at(i);
		if (n.type() != bdecode_node::int_t) return default_val;
		return n.int_value();
	}